

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntru.c
# Opt level: O0

void ntru_encode_ciphertext(uint16_t *ciphertext,uint p,uint q,BinarySink *bs)

{
  uint16_t scale;
  uint uVar1;
  uint64_t qrecip_00;
  uint16_t *out;
  NTRUEncodeSchedule *sched_00;
  NTRUEncodeSchedule *sched;
  uint16_t *biased_ciphertext;
  uint64_t qrecip;
  BinarySink *bs_local;
  uint q_local;
  uint p_local;
  uint16_t *ciphertext_local;
  
  qrecip_00 = reciprocal_for_reduction((uint16_t)q);
  out = (uint16_t *)safemalloc((ulong)p,2,0);
  uVar1 = ciphertext_bias(q);
  ntru_bias(out,ciphertext,uVar1 * 3,p,q);
  scale = invert(3,(uint16_t)q,qrecip_00);
  ntru_scale(out,out,scale,p,q);
  sched_00 = ntru_encode_ciphertext_schedule(p,q);
  ntru_encode(sched_00,out,bs);
  ntru_encode_schedule_free(sched_00);
  ring_free(out,p);
  return;
}

Assistant:

void ntru_encode_ciphertext(const uint16_t *ciphertext, unsigned p, unsigned q,
                            BinarySink *bs)
{
    SETUP;

    /*
     * Bias the ciphertext, and scale down by 1/3, which we do by
     * modular multiplication by the inverse of 3 mod q. (That only
     * works if we know the inputs are all _exact_ multiples of 3
     * - but we do!)
     */
    uint16_t *biased_ciphertext = snewn(p, uint16_t);
    ntru_bias(biased_ciphertext, ciphertext, 3 * ciphertext_bias(q), p, q);
    ntru_scale(biased_ciphertext, biased_ciphertext, INVERT(3), p, q);

    /* Encode. */
    NTRUEncodeSchedule *sched = ntru_encode_ciphertext_schedule(p, q);
    ntru_encode(sched, biased_ciphertext, bs);
    ntru_encode_schedule_free(sched);

    ring_free(biased_ciphertext, p);
}